

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperRefs.c
# Opt level: O3

void Map_MappingSetRefs_rec(Map_Man_t *pMan,Map_Node_t *pNode)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  Map_Cut_t *pMVar4;
  long lVar5;
  Map_Node_t *p;
  
  p = (Map_Node_t *)((ulong)pNode & 0xfffffffffffffffe);
  uVar2 = (uint)pNode & 1;
  uVar3 = (ulong)(uVar2 ^ 1);
  p->nRefAct[2] = p->nRefAct[2] + 1;
  iVar1 = p->nRefAct[uVar3];
  p->nRefAct[uVar3] = iVar1 + 1;
  while( true ) {
    if (iVar1 != 0) {
      return;
    }
    iVar1 = Map_NodeIsVar(p);
    if (iVar1 != 0) break;
    iVar1 = Map_NodeIsBuf(p);
    if (iVar1 == 0) {
      iVar1 = Map_NodeIsAnd(pNode);
      if (iVar1 != 0) {
        pMVar4 = p->pCutBest[uVar3];
        if (pMVar4 == (Map_Cut_t *)0x0) {
          pMVar4 = p->pCutBest[(uint)pNode & 1];
          uVar3 = (ulong)uVar2;
        }
        if (pMan->fUseProfile != 0) {
          Mio_GateIncProfile2((pMVar4->M[uVar3].pSuperBest)->pRoot);
        }
        if ('\0' < pMVar4->nLeaves) {
          uVar2 = pMVar4->M[uVar3].uPhaseBest;
          lVar5 = 0;
          do {
            Map_MappingSetRefs_rec
                      (pMan,(Map_Node_t *)
                            ((ulong)((uVar2 >> ((uint)lVar5 & 0x1f) & 1) != 0) ^
                            (ulong)pMVar4->ppLeaves[lVar5]));
            lVar5 = lVar5 + 1;
          } while (lVar5 < pMVar4->nLeaves);
        }
        return;
      }
      __assert_fail("Map_NodeIsAnd(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperRefs.c"
                    ,0x1b0,"void Map_MappingSetRefs_rec(Map_Man_t *, Map_Node_t *)");
    }
    pNode = (Map_Node_t *)((ulong)((uint)pNode & 1) ^ (ulong)p->p1);
    p = (Map_Node_t *)((ulong)p->p1 & 0xfffffffffffffffe);
    uVar2 = (uint)pNode & 1;
    uVar3 = (ulong)(uVar2 ^ 1);
    p->nRefAct[2] = p->nRefAct[2] + 1;
    iVar1 = p->nRefAct[uVar3];
    p->nRefAct[uVar3] = iVar1 + 1;
  }
  return;
}

Assistant:

void Map_MappingSetRefs_rec( Map_Man_t * pMan, Map_Node_t * pNode )
{
    Map_Cut_t * pCut;
    Map_Node_t * pNodeR;
    unsigned uPhase;
    int i, fPhase, fInvPin;
    // get the regular node and its phase
    pNodeR = Map_Regular(pNode);
    fPhase = !Map_IsComplement(pNode);
    pNodeR->nRefAct[2]++;
    // quit if the node was already visited in this phase
    if ( pNodeR->nRefAct[fPhase]++ )
        return;
    // quit if this is a PI node
    if ( Map_NodeIsVar(pNodeR) )
        return;
    // propagate through buffer
    if ( Map_NodeIsBuf(pNodeR) )
    {
        Map_MappingSetRefs_rec( pMan, Map_NotCond(pNodeR->p1, Map_IsComplement(pNode)) );
        return;
    }
    assert( Map_NodeIsAnd(pNode) );
    // get the cut implementing this or opposite polarity
    pCut = pNodeR->pCutBest[fPhase];
    if ( pCut == NULL )
    {
        fPhase = !fPhase;
        pCut   = pNodeR->pCutBest[fPhase];
    }
    if ( pMan->fUseProfile )
        Mio_GateIncProfile2( pCut->M[fPhase].pSuperBest->pRoot );
    // visit the transitive fanin
    uPhase = pCut->M[fPhase].uPhaseBest;
    for ( i = 0; i < pCut->nLeaves; i++ )
    {
        fInvPin = ((uPhase & (1 << i)) > 0);
        Map_MappingSetRefs_rec( pMan, Map_NotCond(pCut->ppLeaves[i], fInvPin) );
    }
}